

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

ICallback * __thiscall Client::onConnected(Client *this,Client *client)

{
  Client *this_00;
  usize this_01;
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  Uplink *this_02;
  byte *pbVar4;
  bool bVar5;
  long local_60;
  usize postponed;
  undefined1 local_48 [8];
  String response;
  Client *client_local;
  Client *this_local;
  
  response._data.ref = (usize)client;
  pcVar1 = String::operator_cast_to_char_((String *)(this + 0x30));
  Console::printf("Connected to %s:%d\n",pcVar1,(ulong)*(ushort *)(this + 0x58));
  if (((byte)this[0x5a] & 1) != 0) {
    String::String<20ul>((String *)local_48,(char (*) [20])"HTTP/1.1 200 OK\r\n\r\n");
    this_00 = *(Client **)(this + 0x18);
    pcVar1 = String::operator_cast_to_char_((String *)local_48);
    pvVar2 = (void *)String::length((String *)local_48);
    uVar3 = Server::Client::write(this_00,(int)pcVar1,pvVar2,0);
    bVar5 = (uVar3 & 1) == 0;
    if (bVar5) {
      this_local = (Client *)0x0;
    }
    postponed._0_4_ = (uint)bVar5;
    String::~String((String *)local_48);
    if ((uint)postponed != 0) {
      return &this_local->super_ICallback;
    }
  }
  this_02 = (Uplink *)operator_new(0x18);
  Uplink::Uplink(this_02,(Client *)this,(Client *)response._data.ref);
  *(Uplink **)(this + 0x28) = this_02;
  local_60 = 0;
  bVar5 = Buffer::isEmpty((Buffer *)(this + 0x68));
  this_01 = response._data.ref;
  if (!bVar5) {
    pbVar4 = Buffer::operator_cast_to_unsigned_char_((Buffer *)(this + 0x68));
    pvVar2 = (void *)Buffer::size((Buffer *)(this + 0x68));
    uVar3 = Server::Client::write((Client *)this_01,(int)pbVar4,pvVar2,(size_t)&local_60);
    if ((uVar3 & 1) == 0) {
      return (ICallback *)0x0;
    }
    Buffer::clear((Buffer *)(this + 0x68));
  }
  if (local_60 == 0) {
    Server::Client::resume(*(Client **)(this + 0x18));
  }
  return *(ICallback **)(this + 0x28);
}

Assistant:

Server::Client::ICallback *Client::onConnected(Server::Client &client)
{
    Console::printf("Connected to %s:%d\n", (const char*)_target, (int)_targetPort);
    if (_httpConnectMethod)
    {
        String response("HTTP/1.1 200 OK\r\n\r\n");
        if (!_client.write((const byte*)(const char*)response, response.length()))
            return nullptr;
    }
    _uplink = new Uplink(*this, client);
    usize postponed = 0;
    if (!_receiveBuffer.isEmpty())
    {
        if (!client.write(_receiveBuffer, _receiveBuffer.size(), &postponed))
            return nullptr;
        _receiveBuffer.clear();
    }
    if (!postponed)
        _client.resume();
    return _uplink;
}